

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O1

int ORPG::Core::getopt_internal(int argc,char **argv,char *options)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  
  while( true ) {
    iVar5 = optind;
    if (optreset == 0) {
      if (*getopt_internal::place != '\0') goto LAB_001025c5;
    }
    else {
      nonopt_end = -1;
      nonopt_start = -1;
    }
    optreset = 0;
    if (argc <= optind) break;
    pcVar4 = argv[optind];
    if ((*pcVar4 == '-') &&
       ((cVar1 = pcVar4[1], getopt_internal::place = pcVar4, cVar1 != '\0' ||
        (pcVar2 = strchr(options,0x2d), pcVar2 != (char *)0x0)))) {
      if ((nonopt_start != -1) && (nonopt_end == -1)) {
        nonopt_end = iVar5;
      }
      if (((cVar1 == '\0') || (getopt_internal::place = pcVar4 + 1, cVar1 != '-')) ||
         (pcVar4[2] != '\0')) {
        if ((getopt_internal::place[1] == '\0') ||
           (cVar1 = *getopt_internal::place, getopt_internal::place = getopt_internal::place + 1,
           cVar1 != '-')) {
LAB_001025c5:
          pcVar4 = getopt_internal::place + 1;
          cVar1 = *getopt_internal::place;
          iVar5 = (int)cVar1;
          getopt_internal::place = pcVar4;
          optopt = iVar5;
          if (iVar5 != 0x3a) {
            pcVar2 = strchr(options,iVar5);
            if (pcVar2 != (char *)0x0) {
              if (pcVar2[1] == ':') {
                if (*pcVar4 == '\0') {
                  lVar3 = (long)optind;
                  optind = optind + 1;
                  if (argc <= optind) {
                    getopt_internal::place = "";
                    if (opterr == 0) {
                      return 0x3a;
                    }
                    if (*options == ':') {
                      return 0x3a;
                    }
                    getopt_internal();
                    return 0x3a;
                  }
                  pcVar4 = argv[lVar3 + 1];
                }
                getopt_internal::place = "";
                optarg = pcVar4;
              }
              else {
                optarg = (char *)0x0;
                if (*pcVar4 != '\0') {
                  optarg = (char *)0x0;
                  return iVar5;
                }
              }
              optind = optind + 1;
              return iVar5;
            }
            if (cVar1 == '-') {
              return -1;
            }
          }
          if (*pcVar4 == '\0') {
            optind = optind + 1;
          }
          iVar5 = 0x3f;
          if ((opterr != 0) && (*options != ':')) {
            getopt_internal();
          }
        }
        else {
          getopt_internal::place = "";
          iVar5 = -2;
        }
      }
      else {
        optind = iVar5 + 1;
        getopt_internal::place = "";
        if (nonopt_end != -1) {
          permute_args(nonopt_start,nonopt_end,optind,argv);
          optind = optind + (nonopt_start - nonopt_end);
        }
LAB_0010267d:
        iVar5 = -1;
        nonopt_end = -1;
        nonopt_start = -1;
      }
      return iVar5;
    }
    getopt_internal::place = "";
    if (nonopt_start == -1) {
      nonopt_start = iVar5;
    }
    else if (nonopt_end != -1) {
      permute_args(nonopt_start,nonopt_end,iVar5,argv);
      nonopt_start = nonopt_start + (optind - nonopt_end);
      nonopt_end = -1;
    }
    optind = optind + 1;
  }
  getopt_internal::place = "";
  if (nonopt_end == -1) {
    if (nonopt_start == -1) goto LAB_0010267d;
  }
  else {
    permute_args(nonopt_start,nonopt_end,optind,argv);
    nonopt_start = (nonopt_start - nonopt_end) + optind;
  }
  optind = nonopt_start;
  goto LAB_0010267d;
}

Assistant:

int getopt_internal(int argc,
                            char* argv[],
                            const char *options) {
            /* option letter processing */
            static char* place = EMPTY;

            /* option letter list index */
            char* olli;

            /* reset our non-option start and end positions */
            if (optreset)
                nonopt_start = nonopt_end = -1;

            /* update scanning pointer */
            if (optreset || !*place) {
                optreset = 0;

                /* end of argument array */
                if (optind >= argc) {
                    place = EMPTY;

                    if (nonopt_end != -1) {
                        /* do permutation, if we have to
                        TODO: get this working!! */
                        permute_args(nonopt_start, nonopt_end, optind, argv);

                        optind -= nonopt_end - nonopt_start;
                    } else if (nonopt_start != -1) {
                        /* If we skipped non-options, set optind
                        to the first of them. */
                        optind = nonopt_start;
                    }

                    nonopt_start = nonopt_end = -1;

                    return EOF;
                }

                /* check if this is a non-option */
                if(*(place = argv[optind]) != OP_DELIM ||
                (place[1] == '\0' && strchr(options, '-') == NULL)) {
                    place = EMPTY;

                    /* if we found the first non-argument set, then start there
                    otherwise if we found the last non-argument then do a
                    permutation

                    TODO: Get this working!!! */
                    if (nonopt_start == -1)
                        nonopt_start = optind;
                    else if (nonopt_end != -1) {
                        permute_args(nonopt_start, nonopt_end, optind, argv);

                        nonopt_start = optind - (nonopt_end - nonopt_start);
                        nonopt_end = -1;
                    }

                    optind++;

                    return getopt_internal(argc, argv, options);
                }

                if (nonopt_start != -1 && nonopt_end == -1)
                    nonopt_end = optind;

                /* If we have "-" do nothing, if "--" we are done */
                if (place[1] != '\0' && *++place == '-' && place[1] == '\0') {
                    optind++;
                    place = EMPTY;
                    /* We found a long option (--), so if we skipped
                    non-options, we have to permute. */
                    if (nonopt_end != -1) {
                        permute_args(nonopt_start, nonopt_end, optind, argv);
                        optind -= nonopt_end - nonopt_start;
                    }

                    nonopt_start = nonopt_end = -1;

                    return -1;
                }

                /* found "--" */
                if (place[1] && *place++ == OP_DELIM) {
                    /* ++optind; */
                    place = EMPTY;

                    return CONTINUE_CODE;
                }
            }

            /* option letter okay? */
            if ((optopt = (int)*place++) == BADARG ||
                !(olli = (char *)strchr(options, optopt))) {
                /*
                * if the user didn't specify OP_DELIM as an option,
                * assume it means EOF.
                */
                if (optopt == (int)OP_DELIM)
                    return EOF;
                if (!*place)
                    ++optind;
                if (opterr && *options != ':')
                    (void)fprintf(stderr,
                                "%s: illegal option -- %c%s\n",
                                program_name(argv[0]), optopt, place);

                return BADCHAR;
            }
            if (*++olli != ':') {
                /* don't need argument */
                optarg = NULL;
                if (!*place)
                    ++optind;
            } else {
                /* need an argument */

                /* no white space */
                if (*place)
                    optarg = place;
                /* no arg */
                else if (argc <= ++optind) {
                    place = EMPTY;
                    if ((opterr) && (*options != ':'))
                        (void)fprintf(stderr,
                                    "%s: option requires an argument -- %c\n",
                                    program_name(argv[0]), optopt);
                    return BADARG;
                } else
                    /* white space */
                    optarg = argv[optind];

                place = EMPTY;
                ++optind;
            }

            /* dump back option letter */
            return optopt;
        }